

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

WebPEncodingError PutRIFFHeader(VP8Encoder *enc,size_t riff_size)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  uint8_t riff [12];
  WebPPicture *pic;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  WebPEncodingError local_4;
  
  lVar1 = *(long *)(in_RDI + 8);
  PutLE32((uint8_t *)CONCAT44(0x46464952,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  iVar2 = (**(code **)(lVar1 + 0x60))(&stack0xffffffffffffffd4,0xc,lVar1);
  if (iVar2 == 0) {
    local_4 = VP8_ENC_ERROR_BAD_WRITE;
  }
  else {
    local_4 = VP8_ENC_OK;
  }
  return local_4;
}

Assistant:

static WebPEncodingError PutRIFFHeader(const VP8Encoder* const enc,
                                       size_t riff_size) {
  const WebPPicture* const pic = enc->pic_;
  uint8_t riff[RIFF_HEADER_SIZE] = {
    'R', 'I', 'F', 'F', 0, 0, 0, 0, 'W', 'E', 'B', 'P'
  };
  assert(riff_size == (uint32_t)riff_size);
  PutLE32(riff + TAG_SIZE, (uint32_t)riff_size);
  if (!pic->writer(riff, sizeof(riff), pic)) {
    return VP8_ENC_ERROR_BAD_WRITE;
  }
  return VP8_ENC_OK;
}